

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BlobCompare(Mem *pB1,Mem *pB2)

{
  int iVar1;
  int iVar2;
  int local_44;
  int n2;
  int n1;
  int c;
  Mem *pB2_local;
  Mem *pB1_local;
  
  iVar1 = pB1->n;
  iVar2 = pB2->n;
  if (((pB1->flags | pB2->flags) & 0x4000) == 0) {
    local_44 = iVar1;
    if (iVar2 < iVar1) {
      local_44 = iVar2;
    }
    pB1_local._4_4_ = memcmp(pB1->z,pB2->z,(long)local_44);
    if (pB1_local._4_4_ == 0) {
      pB1_local._4_4_ = iVar1 - iVar2;
    }
  }
  else if ((pB1->flags & pB2->flags & 0x4000) == 0) {
    if ((pB1->flags & 0x4000) == 0) {
      iVar2 = isAllZero(pB1->z,pB1->n);
      if (iVar2 == 0) {
        pB1_local._4_4_ = 1;
      }
      else {
        pB1_local._4_4_ = iVar1 - (pB2->u).nZero;
      }
    }
    else {
      iVar1 = isAllZero(pB2->z,pB2->n);
      if (iVar1 == 0) {
        pB1_local._4_4_ = -1;
      }
      else {
        pB1_local._4_4_ = (pB1->u).nZero - iVar2;
      }
    }
  }
  else {
    pB1_local._4_4_ = (pB1->u).nZero - (pB2->u).nZero;
  }
  return pB1_local._4_4_;
}

Assistant:

static SQLITE_NOINLINE int sqlite3BlobCompare(const Mem *pB1, const Mem *pB2){
  int c;
  int n1 = pB1->n;
  int n2 = pB2->n;

  /* It is possible to have a Blob value that has some non-zero content
  ** followed by zero content.  But that only comes up for Blobs formed
  ** by the OP_MakeRecord opcode, and such Blobs never get passed into
  ** sqlite3MemCompare(). */
  assert( (pB1->flags & MEM_Zero)==0 || n1==0 );
  assert( (pB2->flags & MEM_Zero)==0 || n2==0 );

  if( (pB1->flags|pB2->flags) & MEM_Zero ){
    if( pB1->flags & pB2->flags & MEM_Zero ){
      return pB1->u.nZero - pB2->u.nZero;
    }else if( pB1->flags & MEM_Zero ){
      if( !isAllZero(pB2->z, pB2->n) ) return -1;
      return pB1->u.nZero - n2;
    }else{
      if( !isAllZero(pB1->z, pB1->n) ) return +1;
      return n1 - pB2->u.nZero;
    }
  }
  c = memcmp(pB1->z, pB2->z, n1>n2 ? n2 : n1);
  if( c ) return c;
  return n1 - n2;
}